

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseWhitespace(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *utf8Str;
  
  utf8Str = this->m_current;
  cVar2 = *utf8Str;
  if ((cVar2 != '\0') && (utf8Str <= this->m_end)) {
    do {
      if (cVar2 != ' ') {
        if (cVar2 != '\t') break;
        this->m_columnNumber = this->m_columnNumber + 3;
      }
      sVar3 = GetUtf8CharSize(utf8Str);
      pcVar1 = this->m_current;
      utf8Str = pcVar1 + sVar3;
      this->m_current = utf8Str;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar2 = pcVar1[sVar3];
      if ((cVar2 == '\0') || (this->m_end < utf8Str)) break;
    } while( true );
  }
  this->m_columnMarker = this->m_columnNumber;
  return;
}

Assistant:

inline_t void Lexer::ParseWhitespace()
	{
		while (!IsEndOfText())
		{
			if (!IsWhitespace(*m_current))
				break;
			if (*m_current == '\t')
				m_columnNumber += (LogTabWidth - 1);
			AdvanceCurrent();
		}
		m_columnMarker = m_columnNumber;
	}